

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::anon_unknown_0::FieldMaskTree::MergeMessage
          (FieldMaskTree *this,Node *node,Message *source,MergeOptions *options,Message *destination
          )

{
  _Base_ptr key;
  FieldMaskTree *this_00;
  Reflection *this_01;
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  int iVar4;
  uint32 uVar5;
  uint uVar6;
  LogMessage *pLVar7;
  FieldDescriptor *this_02;
  Node *pNVar8;
  MergeOptions *options_00;
  Message *pMVar9;
  Message *pMVar10;
  uint64 uVar11;
  EnumValueDescriptor *pEVar12;
  int64 iVar13;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  int iVar14;
  float fVar15;
  double dVar16;
  string local_f0;
  string local_d0;
  LogMessage local_b0;
  _Base_ptr local_78;
  _Base_ptr local_70;
  Descriptor *local_68;
  Message *local_60;
  LogFinisher local_51;
  Reflection *local_50;
  Reflection *local_48;
  MergeOptions *local_40;
  Node *local_38;
  
  local_60 = source;
  local_40 = options;
  local_38 = node;
  if ((this->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
               ,0x1c5);
    pLVar7 = protobuf::internal::LogMessage::operator<<
                       (&local_b0,"CHECK failed: !node->children.empty(): ");
    protobuf::internal::LogFinisher::operator=(&local_51,pLVar7);
    protobuf::internal::LogMessage::~LogMessage(&local_b0);
  }
  pNVar8 = local_38;
  (**(code **)(*(long *)&(local_38->children)._M_t._M_impl + 0x98))(local_38);
  local_50 = extraout_RDX;
  (**(code **)(*(long *)local_40 + 0x98))();
  local_48 = extraout_RDX_00;
  local_68 = (Descriptor *)(**(code **)(*(long *)&(pNVar8->children)._M_t._M_impl + 0x98))(pNVar8);
  local_78 = (this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_70 = &(this->root_).children._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if (local_78 == local_70) {
      return;
    }
    key = local_78 + 1;
    this_00 = *(FieldMaskTree **)(local_78 + 2);
    this_02 = Descriptor::FindFieldByName(local_68,(string *)key);
    if (this_02 == (FieldDescriptor *)0x0) {
      protobuf::internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
                 ,0x1cf);
      pLVar7 = protobuf::internal::LogMessage::operator<<(&local_b0,"Cannot find field \"");
      pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,(string *)key);
      pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\" in message ");
      pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,*(string **)(local_68 + 8));
      protobuf::internal::LogFinisher::operator=(&local_51,pLVar7);
LAB_003230b2:
      protobuf::internal::LogMessage::~LogMessage(&local_b0);
    }
    else if ((this_00->root_).children._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      if (*(int *)(this_02 + 0x3c) == 3) {
        if (*(char *)((long)&(local_60->super_MessageLite)._vptr_MessageLite + 1) == '\x01') {
          Reflection::ClearField(local_48,(Message *)local_40,this_02);
        }
        CVar2 = FieldDescriptor::cpp_type(this_02);
        switch(CVar2) {
        case CPPTYPE_INT32:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            iVar3 = Reflection::GetRepeatedInt32(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddInt32(local_48,(Message *)local_40,this_02,iVar3);
          }
          break;
        case CPPTYPE_INT64:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            iVar13 = Reflection::GetRepeatedInt64(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddInt64(local_48,(Message *)local_40,this_02,iVar13);
          }
          break;
        case CPPTYPE_UINT32:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            uVar5 = Reflection::GetRepeatedUInt32(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddUInt32(local_48,(Message *)local_40,this_02,uVar5);
          }
          break;
        case CPPTYPE_UINT64:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            uVar11 = Reflection::GetRepeatedUInt64(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddUInt64(local_48,(Message *)local_40,this_02,uVar11);
          }
          break;
        case CPPTYPE_DOUBLE:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            dVar16 = Reflection::GetRepeatedDouble(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddDouble(local_48,(Message *)local_40,this_02,dVar16);
          }
          break;
        case CPPTYPE_FLOAT:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            fVar15 = Reflection::GetRepeatedFloat(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddFloat(local_48,(Message *)local_40,this_02,fVar15);
          }
          break;
        case CPPTYPE_BOOL:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            bVar1 = Reflection::GetRepeatedBool(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddBool(local_48,(Message *)local_40,this_02,bVar1);
          }
          break;
        case CPPTYPE_ENUM:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            pEVar12 = Reflection::GetRepeatedEnum(local_50,(Message *)local_38,this_02,iVar14);
            Reflection::AddEnum(local_48,(Message *)local_40,this_02,pEVar12);
          }
          break;
        case CPPTYPE_STRING:
          uVar6 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          pMVar10 = (Message *)0x0;
          pMVar9 = (Message *)(ulong)uVar6;
          if ((int)uVar6 < 1) {
            pMVar9 = pMVar10;
          }
          while (iVar4 = (int)pMVar10, (int)pMVar9 != iVar4) {
            Reflection::GetRepeatedString_abi_cxx11_
                      (&local_d0,local_50,(Message *)local_38,this_02,iVar4);
            Reflection::AddString(local_48,(Message *)local_40,this_02,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            destination = pMVar10;
            pMVar10 = (Message *)(ulong)(iVar4 + 1);
          }
          break;
        case CPPTYPE_MESSAGE:
          iVar4 = Reflection::FieldSize(local_50,(Message *)local_38,this_02);
          iVar14 = 0;
          if (iVar4 < 1) {
            iVar4 = iVar14;
          }
          for (; iVar4 != iVar14; iVar14 = iVar14 + 1) {
            pMVar9 = Reflection::AddMessage
                               (local_48,(Message *)local_40,this_02,(MessageFactory *)0x0);
            pMVar10 = Reflection::GetRepeatedMessage(local_50,(Message *)local_38,this_02,iVar14);
            (*(pMVar9->super_MessageLite)._vptr_MessageLite[0xf])(pMVar9,pMVar10);
          }
        }
      }
      else {
        CVar2 = FieldDescriptor::cpp_type(this_02);
        this_01 = local_50;
        switch(CVar2) {
        case CPPTYPE_INT32:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (bVar1) {
            iVar3 = Reflection::GetInt32(this_01,(Message *)local_38,this_02);
            Reflection::SetInt32(local_48,(Message *)local_40,this_02,iVar3);
          }
          else {
LAB_00323729:
            Reflection::ClearField(local_48,(Message *)local_40,this_02);
          }
          break;
        case CPPTYPE_INT64:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          iVar13 = Reflection::GetInt64(this_01,(Message *)local_38,this_02);
          Reflection::SetInt64(local_48,(Message *)local_40,this_02,iVar13);
          break;
        case CPPTYPE_UINT32:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          uVar5 = Reflection::GetUInt32(this_01,(Message *)local_38,this_02);
          Reflection::SetUInt32(local_48,(Message *)local_40,this_02,uVar5);
          break;
        case CPPTYPE_UINT64:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          uVar11 = Reflection::GetUInt64(this_01,(Message *)local_38,this_02);
          Reflection::SetUInt64(local_48,(Message *)local_40,this_02,uVar11);
          break;
        case CPPTYPE_DOUBLE:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          dVar16 = Reflection::GetDouble(this_01,(Message *)local_38,this_02);
          Reflection::SetDouble(local_48,(Message *)local_40,this_02,dVar16);
          break;
        case CPPTYPE_FLOAT:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          fVar15 = Reflection::GetFloat(this_01,(Message *)local_38,this_02);
          Reflection::SetFloat(local_48,(Message *)local_40,this_02,fVar15);
          break;
        case CPPTYPE_BOOL:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          bVar1 = Reflection::GetBool(this_01,(Message *)local_38,this_02);
          Reflection::SetBool(local_48,(Message *)local_40,this_02,bVar1);
          break;
        case CPPTYPE_ENUM:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          pEVar12 = Reflection::GetEnum(this_01,(Message *)local_38,this_02);
          Reflection::SetEnum(local_48,(Message *)local_40,this_02,pEVar12);
          break;
        case CPPTYPE_STRING:
          bVar1 = Reflection::HasField(local_50,(Message *)local_38,this_02);
          if (!bVar1) goto LAB_00323729;
          Reflection::GetString_abi_cxx11_(&local_f0,this_01,(Message *)local_38,this_02);
          Reflection::SetString(local_48,(Message *)local_40,this_02,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          break;
        case CPPTYPE_MESSAGE:
          if (*(char *)&(local_60->super_MessageLite)._vptr_MessageLite == '\x01') {
            Reflection::ClearField(local_48,(Message *)local_40,this_02);
          }
          bVar1 = Reflection::HasField(this_01,(Message *)local_38,this_02);
          if (bVar1) {
            pMVar9 = Reflection::MutableMessage
                               (local_48,(Message *)local_40,this_02,(MessageFactory *)0x0);
            pMVar10 = Reflection::GetMessage
                                (local_50,(Message *)local_38,this_02,(MessageFactory *)0x0);
            (*(pMVar9->super_MessageLite)._vptr_MessageLite[0xf])(pMVar9,pMVar10);
          }
        }
      }
    }
    else {
      if ((*(int *)(this_02 + 0x3c) == 3) ||
         (CVar2 = FieldDescriptor::cpp_type(this_02), CVar2 != CPPTYPE_MESSAGE)) {
        protobuf::internal::LogMessage::LogMessage
                  (&local_b0,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/field_mask_util.cc"
                   ,0x1d7);
        pLVar7 = protobuf::internal::LogMessage::operator<<(&local_b0,"Field \"");
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,(string *)key);
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\" in message ");
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,*(string **)(local_68 + 8));
        pLVar7 = protobuf::internal::LogMessage::operator<<
                           (pLVar7," is not a singular message field and cannot ");
        pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"have sub-fields.");
        protobuf::internal::LogFinisher::operator=(&local_51,pLVar7);
        goto LAB_003230b2;
      }
      pNVar8 = (Node *)Reflection::GetMessage
                                 (local_50,(Message *)local_38,this_02,(MessageFactory *)0x0);
      options_00 = (MergeOptions *)
                   Reflection::MutableMessage
                             (local_48,(Message *)local_40,this_02,(MessageFactory *)0x0);
      MergeMessage(this_00,pNVar8,local_60,options_00,destination);
    }
    local_78 = (_Base_ptr)std::_Rb_tree_increment(local_78);
  } while( true );
}

Assistant:

void FieldMaskTree::MergeMessage(const Node* node, const Message& source,
                                 const FieldMaskUtil::MergeOptions& options,
                                 Message* destination) {
  GOOGLE_DCHECK(!node->children.empty());
  const Reflection* source_reflection = source.GetReflection();
  const Reflection* destination_reflection = destination->GetReflection();
  const Descriptor* descriptor = source.GetDescriptor();
  for (std::map<std::string, Node*>::const_iterator it = node->children.begin();
       it != node->children.end(); ++it) {
    const std::string& field_name = it->first;
    const Node* child = it->second;
    const FieldDescriptor* field = descriptor->FindFieldByName(field_name);
    if (field == NULL) {
      GOOGLE_LOG(ERROR) << "Cannot find field \"" << field_name << "\" in message "
                 << descriptor->full_name();
      continue;
    }
    if (!child->children.empty()) {
      // Sub-paths are only allowed for singular message fields.
      if (field->is_repeated() ||
          field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
        GOOGLE_LOG(ERROR) << "Field \"" << field_name << "\" in message "
                   << descriptor->full_name()
                   << " is not a singular message field and cannot "
                   << "have sub-fields.";
        continue;
      }
      MergeMessage(child, source_reflection->GetMessage(source, field), options,
                   destination_reflection->MutableMessage(destination, field));
      continue;
    }
    if (!field->is_repeated()) {
      switch (field->cpp_type()) {
#define COPY_VALUE(TYPE, Name)                                              \
  case FieldDescriptor::CPPTYPE_##TYPE: {                                   \
    if (source_reflection->HasField(source, field)) {                       \
      destination_reflection->Set##Name(                                    \
          destination, field, source_reflection->Get##Name(source, field)); \
    } else {                                                                \
      destination_reflection->ClearField(destination, field);               \
    }                                                                       \
    break;                                                                  \
  }
        COPY_VALUE(BOOL, Bool)
        COPY_VALUE(INT32, Int32)
        COPY_VALUE(INT64, Int64)
        COPY_VALUE(UINT32, UInt32)
        COPY_VALUE(UINT64, UInt64)
        COPY_VALUE(FLOAT, Float)
        COPY_VALUE(DOUBLE, Double)
        COPY_VALUE(ENUM, Enum)
        COPY_VALUE(STRING, String)
#undef COPY_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          if (options.replace_message_fields()) {
            destination_reflection->ClearField(destination, field);
          }
          if (source_reflection->HasField(source, field)) {
            destination_reflection->MutableMessage(destination, field)
                ->MergeFrom(source_reflection->GetMessage(source, field));
          }
          break;
        }
      }
    } else {
      if (options.replace_repeated_fields()) {
        destination_reflection->ClearField(destination, field);
      }
      switch (field->cpp_type()) {
#define COPY_REPEATED_VALUE(TYPE, Name)                            \
  case FieldDescriptor::CPPTYPE_##TYPE: {                          \
    int size = source_reflection->FieldSize(source, field);        \
    for (int i = 0; i < size; ++i) {                               \
      destination_reflection->Add##Name(                           \
          destination, field,                                      \
          source_reflection->GetRepeated##Name(source, field, i)); \
    }                                                              \
    break;                                                         \
  }
        COPY_REPEATED_VALUE(BOOL, Bool)
        COPY_REPEATED_VALUE(INT32, Int32)
        COPY_REPEATED_VALUE(INT64, Int64)
        COPY_REPEATED_VALUE(UINT32, UInt32)
        COPY_REPEATED_VALUE(UINT64, UInt64)
        COPY_REPEATED_VALUE(FLOAT, Float)
        COPY_REPEATED_VALUE(DOUBLE, Double)
        COPY_REPEATED_VALUE(ENUM, Enum)
        COPY_REPEATED_VALUE(STRING, String)
#undef COPY_REPEATED_VALUE
        case FieldDescriptor::CPPTYPE_MESSAGE: {
          int size = source_reflection->FieldSize(source, field);
          for (int i = 0; i < size; ++i) {
            destination_reflection->AddMessage(destination, field)
                ->MergeFrom(
                    source_reflection->GetRepeatedMessage(source, field, i));
          }
          break;
        }
      }
    }
  }
}